

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cpp
# Opt level: O0

double evaluate2_sweet(Board brd,Block *block,double *inh,bool last_layer)

{
  int iVar1;
  uint uVar2;
  pair<int,_int> pVar3;
  int *piVar4;
  byte in_DL;
  double *in_RSI;
  Block *in_RDI;
  double dVar5;
  double red_hole;
  double p [6];
  int i_3;
  int maxheight;
  int i_2;
  int row;
  int holenum;
  int cur_1;
  int i_1;
  int coltrans;
  int j;
  int cur;
  int i;
  int wellsum;
  int rowtrans;
  double land;
  double sweet;
  int *cols;
  int *rows;
  pair<int,_int> elim;
  int basenum;
  int local_b8 [2];
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  Block *in_stack_ffffffffffffff70;
  double dVar6;
  Board *in_stack_ffffffffffffff78;
  double dVar7;
  int local_74;
  int local_70;
  int local_6c;
  uint local_68;
  int local_64;
  int local_5c;
  int local_58;
  int local_54;
  uint local_50;
  int local_4c;
  int local_48;
  int local_44;
  double local_38;
  int local_20;
  int iStack_1c;
  
  iVar1 = Board::place((Board *)&stack0x00000008,in_RDI);
  pVar3 = Board::eliminate(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  local_38 = 0.0;
  if (iVar1 == 4) {
    local_38 = 20.0;
    iStack_1c = pVar3.second;
    if (iStack_1c == 3) {
      local_38 = 70.0;
    }
    if (iStack_1c == 4) {
      local_38 = local_38 + 100.0;
    }
  }
  local_20 = pVar3.first;
  dVar5 = ((double)((in_RDI->x - local_20) - blockHalfHeight[in_RDI->t][in_RDI->o]) +
          (double)(blockHeight[in_RDI->t][in_RDI->o] + -1) / 2.0) - 1.0;
  local_44 = 0;
  local_48 = 0;
  for (local_4c = 1; local_4c < 0x15; local_4c = local_4c + 1) {
    uVar2 = ((Board *)&stack0x00000008)->rows[local_4c];
    local_44 = bitcount[(int)(uVar2 ^ (int)uVar2 >> 1)] + -1 + local_44;
    local_54 = local_4c;
    for (local_50 = (uVar2 ^ 0xffffffff) & (int)uVar2 >> 1 & uVar2 << 1; local_50 != 0;
        local_50 = (((Board *)&stack0x00000008)->rows[local_54] ^ 0xffffffffU) & local_50) {
      local_48 = bitcount[(int)local_50] + local_48;
      local_54 = local_54 + -1;
    }
  }
  local_58 = 0;
  for (local_5c = 1; local_5c < 0xb; local_5c = local_5c + 1) {
    uVar2 = (&row)[local_5c] >> 1 ^ (&row)[local_5c];
    local_58 = bitcount[(int)(uVar2 & 0x7ff)] + bitcount[(int)uVar2 >> 0xc] + local_58;
  }
  local_64 = 0;
  local_68 = 0;
  for (local_6c = 0x13; 0 < local_6c; local_6c = local_6c + -1) {
    local_68 = (((Board *)&stack0x00000008)->rows[local_6c] ^ 0xffffffffU) &
               (((Board *)&stack0x00000008)->rows[local_6c + 1] | local_68);
    local_64 = bitcount[(int)(local_68 & 0x7ff)] + bitcount[(int)local_68 >> 0xc] + local_64;
  }
  local_70 = 0;
  local_74 = 0x14;
  do {
    if (local_74 < 1) {
LAB_00142dd1:
      memset(&local_a8,0,0x30);
      local_a8 = 5.00016;
      local_a0 = 1.11813;
      local_98 = 6.71788;
      dVar6 = 12.3487;
      dVar7 = 11.3993;
      *in_RSI = dVar5 * -5.00016 + (double)local_20 * 1.11813 + local_38;
      local_b0 = 0.0;
      if ((in_DL & 1) == 1) {
        local_b8[1] = 0;
        local_b8[0] = 0xe - local_70;
        piVar4 = std::max<int>(local_b8 + 1,local_b8);
        local_b0 = (double)*piVar4 * 0.15;
      }
      return (double)local_48 * -8.2856 +
             -(dVar7 + local_b0) * (double)local_64 +
             -(dVar6 + local_b0) * (double)local_58 +
             -local_98 * (double)local_44 + -local_a8 * dVar5 + local_a0 * (double)local_20 +
             local_38;
    }
    if (((Board *)&stack0x00000008)->rows[local_74] != 0x801) {
      local_70 = local_74;
      goto LAB_00142dd1;
    }
    local_74 = local_74 + -1;
  } while( true );
}

Assistant:

double evaluate2_sweet(Board brd, const Block &block, double &inh, bool last_layer)
{
    int basenum = brd.place(block);
    pair<int, int> elim = brd.eliminate(&block);
    int *rows = brd.rows;
    int *cols = brd.cols;

    double sweet = 0;
    if (basenum == 4) {
        //sweet += 10;
        sweet += 20;
        if (elim.second == 3)
            sweet += 50;
        if (elim.second == 4)
            sweet += 100;
    }

    double land = block.x - elim.first - blockHalfHeight[block.t][block.o]
                  + (blockHeight[block.t][block.o] - 1) / 2.0 - 1;

    //int cntdown[MAPWIDTH + 2] = {};
    int rowtrans = 0;
    int wellsum = 0;
    for (int i = 1; i <= MAPHEIGHT; ++i) {
        int cur = rows[i];
        rowtrans += bitcount[cur ^ (cur >> 1)] - 1;
        cur = (~cur) & (cur >> 1) & (cur << 1);
        int j = i;
        while (cur) {
            wellsum += bitcount[cur];
            cur &= ~rows[--j];
        }
    }

    int coltrans = 0;
    for (int i = 1; i <= MAPWIDTH; ++i) {
        int cur = cols[i];
        cur ^= cur >> 1;
        coltrans += bitcount[cur & 2047] + bitcount[cur >> 12];
    }

    int holenum = 0;
    int row = 0;
    for (int i = MAPHEIGHT - 1; i > 0; --i) {
        row = (~rows[i]) & (rows[i + 1] | row);
        holenum += bitcount[row & 2047] + bitcount[row >> 12];
    }


    int maxheight = 0;
    for (int i = MAPHEIGHT; i >= 1; --i)
        if (rows[i]^Board::EMPTY_ROW) {
            maxheight = i;
            break;
        }

    const double p[6] = {5.00016, 1.11813, 6.71788, 12.3487, 11.3993, 8.2856};
    inh = - p[0] * land
          + p[1] * elim.first
          + sweet;

    double red_hole = 0;
    if (last_layer == 1)
        red_hole = max(0, RED_HOLE_HEIGHT - maxheight) * RED_HOLE_WEIGHT;
    return  - p[0] * land
            + p[1] * elim.first
            - p[2] * rowtrans
            - (p[3] + red_hole) * coltrans
            - (p[4] + red_hole) * holenum
            - p[5] * wellsum
            + sweet;
    /*inh = - 4.500158825082766 * land
          + 3.4181268101392694 * elim.first
          + sweet;

    return  - 4.500158825082766 * land
            + 3.4181268101392694 * elim.first
            - 3.2178882868487753 * rowtrans
            - 9.348695305445199 * coltrans
            - 7.899265427351652 * holenum
            - 3.3855972247263626 * wellsum
            + sweet;*/
}